

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_sub2_i32_s390x
               (TCGContext_conflict12 *tcg_ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 al,TCGv_i32 ah,
               TCGv_i32 bl,TCGv_i32 bh)

{
  uc_struct_conflict14 *val;
  void *pvVar1;
  uint64_t val_00;
  uintptr_t o;
  TCGOp *pTVar2;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  TCGv_i64 pTVar5;
  TCGv_i32 pTVar6;
  uintptr_t o_5;
  uintptr_t o_1;
  list_item *plVar7;
  uintptr_t o_3;
  uintptr_t o_7;
  uintptr_t o_6;
  list_item *plVar8;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  val = tcg_ctx->uc;
  plVar8 = val->hook[0x10].head;
  if (plVar8 != (list_item *)0x0) {
    plVar7 = plVar8;
    do {
      pvVar1 = plVar7->data;
      if ((*(ulong *)((long)pvVar1 + 0x20) < *(ulong *)((long)pvVar1 + 0x18) ||
           tcg_ctx->pc_start <= *(ulong *)((long)pvVar1 + 0x20) &&
           *(ulong *)((long)pvVar1 + 0x18) <= tcg_ctx->pc_start) &&
         (*(char *)((long)pvVar1 + 0x14) == '\0')) goto LAB_00c9fb4d;
      plVar7 = plVar7->next;
    } while (plVar7 != (list_item *)0x0);
  }
  goto LAB_00c9fae5;
  while( true ) {
    if (((*(char *)((long)pvVar1 + 0x14) == '\0') && (*(int *)((long)pvVar1 + 0xc) == 0)) &&
       (*(int *)((long)pvVar1 + 0x10) == 0)) {
      ts = tcg_temp_new_internal_s390x(tcg_ctx,TCG_TYPE_I64,false);
      ts_00 = tcg_temp_new_internal_s390x(tcg_ctx,TCG_TYPE_I64,false);
      tcg_gen_concat_i32_i64_s390x(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),al,ah);
      tcg_gen_concat_i32_i64_s390x(tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),bl,bh);
      val_00 = tcg_ctx->pc_start;
      pTVar3 = tcg_const_i64_s390x(tcg_ctx,(int64_t)pvVar1);
      pTVar4 = tcg_const_i64_s390x(tcg_ctx,(int64_t)val);
      pTVar5 = tcg_const_i64_s390x(tcg_ctx,val_00);
      pTVar6 = tcg_const_i32_s390x(tcg_ctx,0x20);
      local_68 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
      local_60 = ts;
      local_58 = ts_00;
      local_50 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
      local_48 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
      local_40 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
      tcg_gen_callN_s390x(tcg_ctx,helper_uc_traceopcode,(TCGTemp *)0x0,6,&local_68);
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      tcg_temp_free_internal_s390x(tcg_ctx,ts);
      tcg_temp_free_internal_s390x(tcg_ctx,ts_00);
    }
    plVar8 = plVar8->next;
    if (plVar8 == (list_item *)0x0) break;
LAB_00c9fb4d:
    pvVar1 = plVar8->data;
    if (pvVar1 == (void *)0x0) break;
  }
LAB_00c9fae5:
  pTVar2 = tcg_emit_op_s390x(tcg_ctx,INDEX_op_sub2_i32);
  pTVar2->args[0] = (TCGArg)(rl + (long)tcg_ctx);
  pTVar2->args[1] = (TCGArg)(rh + (long)tcg_ctx);
  pTVar2->args[2] = (TCGArg)(al + (long)tcg_ctx);
  pTVar2->args[3] = (TCGArg)(ah + (long)tcg_ctx);
  pTVar2->args[4] = (TCGArg)(bl + (long)tcg_ctx);
  pTVar2->args[5] = (TCGArg)(bh + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_sub2_i32(TCGContext *tcg_ctx, TCGv_i32 rl, TCGv_i32 rh, TCGv_i32 al,
                      TCGv_i32 ah, TCGv_i32 bl, TCGv_i32 bh)
{
    uc_engine *uc = tcg_ctx->uc;

    if (TCG_TARGET_HAS_sub2_i32) {
        if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_TCG_OPCODE, tcg_ctx->pc_start)) {
            struct hook *hook;
            HOOK_FOREACH_VAR_DECLARE;
            HOOK_FOREACH(uc, hook, UC_HOOK_TCG_OPCODE) {
                if (hook->to_delete)
                    continue;
                if (hook->op == UC_TCG_OP_SUB && hook->op_flags == 0) {
                    // Calling tcg_gen_sub_i64 will cause infinite recursion.
                    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
                    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
                    tcg_gen_concat_i32_i64(tcg_ctx, t0, al, ah);
                    tcg_gen_concat_i32_i64(tcg_ctx, t1, bl, bh);
                    gen_uc_traceopcode(tcg_ctx, hook, t0, t1, 32, uc, tcg_ctx->pc_start);
                    tcg_temp_free_i64(tcg_ctx, t0);
                    tcg_temp_free_i64(tcg_ctx, t1);
                }
            }
        }
        tcg_gen_op6_i32(tcg_ctx, INDEX_op_sub2_i32, rl, rh, al, ah, bl, bh);
    } else {
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_concat_i32_i64(tcg_ctx, t0, al, ah);
        tcg_gen_concat_i32_i64(tcg_ctx, t1, bl, bh);
        tcg_gen_sub_i64(tcg_ctx, t0, t0, t1);
        tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
    }
}